

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  iterator __position;
  iterator __position_00;
  pointer pBVar10;
  pointer pBVar11;
  Mat *this_02;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  float *pfVar16;
  ulong uVar17;
  pointer pfVar18;
  BBoxRect *pBVar19;
  pointer pMVar20;
  float *pfVar21;
  int j;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  float *pfVar25;
  float *pfVar26;
  long lVar27;
  float *pfVar28;
  pointer pvVar29;
  uint uVar30;
  long lVar31;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_208;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_1e8;
  YoloDetectionOutput *local_1c8;
  float local_1bc;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_1b8;
  ulong local_1a0;
  vector<float,_std::allocator<float>_> local_198;
  int local_180;
  Allocator *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  ulong local_158;
  vector<float,_std::allocator<float>_> local_148;
  float local_128;
  uint uStack_124;
  undefined8 uStack_120;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_110;
  Option *local_108;
  ulong local_100;
  long local_f8;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined1 local_b8 [16];
  int local_a8;
  ulong local_98;
  long local_90;
  pointer local_88;
  float *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pMVar20 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_110 = bottom_top_blobs;
  local_108 = opt;
  if ((bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar20) {
    uVar23 = 0;
    local_1c8 = this;
    do {
      iVar22 = pMVar20[uVar23].c / this->num_box;
      if (iVar22 != this->num_class + 5) {
        iVar22 = -1;
        goto LAB_0042ae72;
      }
      uVar3 = pMVar20[uVar23].w;
      uVar5 = pMVar20[uVar23].h;
      uStack_120 = 0;
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128 = (float)uVar3;
      uStack_124 = uVar5;
      local_98 = uVar23;
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::resize(&local_1e8,(long)this->num_box);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(&local_208,(long)this->num_box);
      if (0 < this->num_box) {
        local_88 = pMVar20 + uVar23;
        auVar15._4_4_ = uStack_124;
        auVar15._0_4_ = local_128;
        auVar15._8_8_ = uStack_120;
        local_100 = (ulong)uStack_124;
        local_f0 = (ulong)(uint)local_128;
        fVar32 = (float)(int)((ulong)uStack_120 >> 0x20);
        auVar34._4_4_ = (float)(int)uStack_124;
        auVar34._0_4_ = (float)(int)local_128;
        auVar34._8_4_ = (float)(int)uStack_120;
        auVar34._12_4_ = fVar32;
        auVar34 = rcpps(auVar15,auVar34);
        local_78 = auVar34._0_4_;
        fStack_74 = auVar34._4_4_;
        fStack_70 = auVar34._8_4_;
        fStack_6c = auVar34._12_4_;
        local_78 = (1.0 - (float)(int)local_128 * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)(int)uStack_124 * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (0.0 - (float)(int)uStack_120 * fStack_70) * fStack_70 + fStack_70;
        fStack_6c = (0.0 - fVar32 * fStack_6c) * fStack_6c + fStack_6c;
        local_90 = (long)iVar22;
        lVar31 = 0;
        do {
          lVar27 = lVar31 * local_90;
          local_e8 = *(undefined8 *)((long)(this->biases).data + lVar31 * 8);
          uStack_e0 = 0;
          sVar8 = local_88->cstep;
          pvVar9 = local_88->data;
          pBVar19 = (BBoxRect *)local_88->elemsize;
          local_160 = this->num_class;
          local_16c = local_88->w;
          local_168 = local_88->h;
          local_164 = local_88->d;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((lVar27 + 5) * sVar8 * (long)pBVar19 + (long)pvVar9);
          local_180 = local_88->elempack;
          local_178 = local_88->allocator;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158 = ((long)local_164 * (long)pBVar19 * (long)local_168 * (long)local_16c + 0xfU &
                      0xfffffffffffffff0) / (ulong)pBVar19;
          local_170 = local_88->dims;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pBVar19;
          (*this->softmax->_vptr_Layer[9])(this->softmax,&local_198,local_108);
          local_f8 = lVar31;
          if (0 < (int)local_100) {
            pfVar16 = (float *)(sVar8 * lVar27 * (long)pBVar19 + (long)pvVar9);
            pfVar26 = (float *)((lVar27 + 1) * sVar8 * (long)pBVar19 + (long)pvVar9);
            pfVar21 = (float *)((lVar27 + 2) * sVar8 * (long)pBVar19 + (long)pvVar9);
            pfVar28 = (float *)((lVar27 + 3) * sVar8 * (long)pBVar19 + (long)pvVar9);
            pfVar25 = (float *)((lVar27 + 4) * sVar8 * (long)pBVar19 + (long)pvVar9);
            local_e8 = CONCAT44(local_e8._4_4_ * 0.5,(float)local_e8 * 0.5);
            uStack_e0 = CONCAT44(uStack_e0._4_4_ * 0.0,(float)uStack_e0 * 0.0);
            local_1a0 = 0;
            do {
              if (0 < (int)local_f0) {
                local_68 = ZEXT416((uint)(float)(int)local_1a0);
                lVar31 = 0;
                uVar23 = 0;
                do {
                  local_128 = *pfVar21;
                  local_c8 = *pfVar28;
                  local_d8 = -*pfVar16;
                  fStack_d4 = -*pfVar26;
                  uStack_d0 = 0x80000000;
                  uStack_cc = 0x80000000;
                  local_80 = pfVar16;
                  local_48 = expf(local_d8);
                  fStack_44 = extraout_XMM0_Db;
                  local_58 = expf(fStack_d4);
                  fStack_54 = extraout_XMM0_Db_00;
                  local_d8 = expf(local_c8);
                  local_c8 = expf(local_128);
                  local_128 = SUB84(pfVar25,0);
                  uStack_124 = (uint)((ulong)pfVar25 >> 0x20);
                  fVar32 = expf(-*pfVar25);
                  lVar27 = local_f8;
                  if ((long)local_1c8->num_class < 1) {
                    iVar22 = 0;
                    auVar34 = ZEXT816(0);
                  }
                  else {
                    pfVar16 = (float *)(local_1a0 *
                                        (long)local_198.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage *
                                        (long)local_16c + lVar31 +
                                       (long)local_198.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start);
                    fVar37 = 0.0;
                    uVar24 = 0;
                    uVar17 = 0;
                    do {
                      fVar33 = *pfVar16;
                      bVar12 = fVar37 < fVar33;
                      if (fVar33 <= fVar37) {
                        fVar33 = fVar37;
                      }
                      fVar37 = fVar33;
                      auVar34 = ZEXT416((uint)fVar37);
                      if (bVar12) {
                        uVar17 = uVar24 & 0xffffffff;
                      }
                      iVar22 = (int)uVar17;
                      uVar24 = uVar24 + 1;
                      pfVar16 = (float *)((long)pfVar16 +
                                         (long)local_198.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage *
                                         local_158);
                    } while ((long)local_1c8->num_class != uVar24);
                  }
                  auVar35._4_12_ = auVar34._4_12_;
                  auVar35._0_4_ = auVar34._0_4_ / (fVar32 + 1.0);
                  local_1bc = auVar35._0_4_;
                  if (local_1c8->confidence_threshold <= auVar35._0_4_) {
                    auVar13._4_4_ = local_58 + 1.0;
                    auVar13._0_4_ = local_48 + 1.0;
                    auVar13._8_4_ = fStack_44 + 0.0;
                    auVar13._12_4_ = fStack_54 + 0.0;
                    auVar34 = rcpps(auVar35,auVar13);
                    fVar32 = auVar34._0_4_;
                    fVar37 = auVar34._4_4_;
                    fVar32 = ((float)(int)uVar23 + fVar32 +
                             (1.0 - (local_48 + 1.0) * fVar32) * fVar32) * local_78;
                    fVar37 = ((float)local_68._0_4_ + fVar37 +
                             (1.0 - (local_58 + 1.0) * fVar37) * fVar37) * fStack_74;
                    fVar38 = local_c8 * (float)local_e8 * local_78;
                    fVar39 = local_d8 * local_e8._4_4_ * fStack_74;
                    fVar33 = fVar32 - fVar38;
                    fVar36 = fVar37 - fVar39;
                    fVar38 = fVar38 + fVar32;
                    fVar39 = fVar39 + fVar37;
                    local_b8 = CONCAT88(CONCAT44(fVar39,fVar38),CONCAT44(fVar36,fVar33));
                    this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                              (local_1e8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_f8);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_a8 = iVar22;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                      _M_realloc_insert<ncnn::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_b8);
                    }
                    else {
                      (__position._M_current)->label = iVar22;
                      (__position._M_current)->xmin = fVar33;
                      (__position._M_current)->ymin = fVar36;
                      (__position._M_current)->xmax = fVar38;
                      (__position._M_current)->ymax = fVar39;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                    }
                    this_01 = (vector<float,std::allocator<float>> *)
                              (local_208.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar27);
                    __position_00._M_current = *(float **)(this_01 + 8);
                    if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                (this_01,__position_00,&local_1bc);
                    }
                    else {
                      *__position_00._M_current = local_1bc;
                      *(float **)(this_01 + 8) = __position_00._M_current + 1;
                    }
                  }
                  pfVar16 = local_80 + 1;
                  pfVar26 = pfVar26 + 1;
                  pfVar21 = pfVar21 + 1;
                  pfVar28 = pfVar28 + 1;
                  pfVar25 = (float *)(CONCAT44(uStack_124,local_128) + 4);
                  uVar23 = uVar23 + 1;
                  lVar31 = lVar31 + 4;
                } while (uVar23 != local_f0);
              }
              local_1a0 = local_1a0 + 1;
            } while (local_1a0 != local_100);
          }
          lVar31 = local_f8;
          this = local_1c8;
          if ((BBoxRect *)
              local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != (BBoxRect *)0x0) {
            LOCK();
            *local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 (float)((int)*local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1);
            UNLOCK();
            if (*local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish == 0.0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < this->num_box);
        if (0 < this->num_box) {
          lVar31 = 8;
          lVar27 = 0;
          do {
            pvVar29 = local_208.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                      ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1b8,
                       local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_1e8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar31 + -8),
                       *(undefined8 *)
                        ((long)&((local_1e8.
                                  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)
                                ._M_impl.super__Vector_impl_data._M_start + lVar31));
            std::vector<float,std::allocator<float>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                      ((vector<float,std::allocator<float>> *)&local_148,
                       local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       *(undefined8 *)((long)pvVar29 + lVar31 + -8),
                       *(undefined8 *)
                        ((long)&(pvVar29->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                .super__Vector_impl_data._M_start + lVar31));
            lVar27 = lVar27 + 1;
            lVar31 = lVar31 + 0x18;
          } while (lVar27 < this->num_box);
        }
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_208);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector(&local_1e8);
      uVar23 = local_98 + 1;
      pMVar20 = (local_110->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar23 < (ulong)(((long)(local_110->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar20 >> 3)
                             * -0x71c71c71c71c71c7));
    if ((local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::BBoxRect>
                (&local_1b8,&local_148,0,
                 (int)((ulong)((long)local_148.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_148.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  pBVar10 = local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pBVar11 = local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8 = (YoloDetectionOutput *)CONCAT44(local_1c8._4_4_,this->nms_threshold);
  pvVar29 = (pointer)(((long)local_1b8.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1b8.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_198,(size_type)pvVar29,(allocator_type *)&local_208);
  if (pBVar10 != pBVar11) {
    pfVar16 = &(local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start)->xmax;
    lVar31 = 0;
    do {
      uVar4 = ((BBoxRect *)(pfVar16 + -2))->xmin;
      uVar6 = ((BBoxRect *)(pfVar16 + -2))->ymin;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar31] =
           ((float)((ulong)*(undefined8 *)pfVar16 >> 0x20) - (float)uVar6) *
           ((float)*(undefined8 *)pfVar16 - (float)uVar4);
      lVar31 = lVar31 + 1;
      pfVar16 = pfVar16 + 5;
    } while ((long)&(pvVar29->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start + (ulong)(pvVar29 == (pointer)0x0) != lVar31);
    local_208.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    do {
      uVar30 = (uint)((ulong)((long)local_1e8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1e8.
                                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((int)uVar30 < 1) {
LAB_0042abfe:
        if (local_1e8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_1e8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1e8,
                     (iterator)
                     local_1e8.
                     super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_208);
        }
        else {
          *(pointer *)
           local_1e8.
           super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish =
               local_208.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1e8.
          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_1e8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
        }
      }
      else {
        pBVar11 = local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  (long)local_208.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        fVar32 = pBVar11->xmin;
        bVar12 = true;
        uVar23 = 0;
        do {
          pBVar10 = (&((local_1e8.
                        super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                      super__Vector_impl_data._M_start)[uVar23];
          fVar37 = local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pBVar10].xmax;
          fVar33 = 0.0;
          if (fVar32 <= fVar37) {
            pBVar1 = local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)pBVar10;
            fVar36 = pBVar11->xmax;
            fVar38 = pBVar1->xmin;
            if (fVar38 <= fVar36) {
              fVar39 = pBVar11->ymin;
              fVar40 = pBVar1->ymax;
              if (fVar39 <= fVar40) {
                fVar2 = pBVar11->ymax;
                fVar41 = pBVar1->ymin;
                if (fVar41 <= fVar2) {
                  if (fVar36 <= fVar37) {
                    fVar37 = fVar36;
                  }
                  if (fVar38 <= fVar32) {
                    fVar38 = fVar32;
                  }
                  if (fVar2 <= fVar40) {
                    fVar40 = fVar2;
                  }
                  if (fVar41 <= fVar39) {
                    fVar41 = fVar39;
                  }
                  fVar33 = (fVar40 - fVar41) * (fVar37 - fVar38);
                }
              }
            }
          }
          if (local_1c8._0_4_ <
              fVar33 / ((local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)local_208.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start] - fVar33) +
                       local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)pBVar10])) {
            bVar12 = false;
          }
          uVar23 = uVar23 + 1;
        } while ((uVar30 & 0x7fffffff) != uVar23);
        if (bVar12) goto LAB_0042abfe;
      }
      local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((local_208.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start + 1);
    } while (local_208.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start < pvVar29);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar22 = 0;
  if (local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar23 = 0;
    do {
      pBVar11 = (&((local_1e8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                  super__Vector_impl_data._M_start)[uVar23];
      pBVar19 = local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)pBVar11;
      if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_realloc_insert<ncnn::BBoxRect_const&>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                   (iterator)
                   local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,pBVar19);
      }
      else {
        *(int *)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x10) = pBVar19->label;
        fVar32 = pBVar19->ymin;
        uVar14 = *(undefined8 *)&pBVar19->xmax;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[0] = pBVar19->xmin;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish[1] = fVar32;
        *(undefined8 *)
         ((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 8) = uVar14;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 0x14);
      }
      if (local_208.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_208.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_208,
                   (iterator)
                   local_208.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)pBVar11);
      }
      else {
        *(float *)local_208.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
             local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)pBVar11];
        local_208.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_208.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < (ulong)((long)local_1e8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1e8.
                                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    uVar30 = (int)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    iVar22 = 0;
    if (uVar30 != 0) {
      this_02 = (local_110->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar30,4,local_108->blob_allocator);
      iVar22 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar22 = 0, 0 < (int)uVar30)) {
        iVar7 = this_02->w;
        sVar8 = this_02->elemsize;
        pfVar18 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        pfVar16 = (float *)((long)this_02->data + 0x14);
        iVar22 = 0;
        uVar23 = 0;
        do {
          fVar32 = *(float *)((long)&((local_208.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                     super__Vector_impl_data._M_start + uVar23 * 4);
          pfVar16[-5] = (float)(int)*pfVar18 + 1.0;
          pfVar16[-4] = fVar32;
          pfVar16[-3] = pfVar18[-4];
          pfVar16[-2] = pfVar18[-3];
          pfVar16[-1] = pfVar18[-2];
          *pfVar16 = pfVar18[-1];
          uVar23 = uVar23 + 1;
          pfVar18 = pfVar18 + 5;
          pfVar16 = (float *)((long)pfVar16 + (long)iVar7 * sVar8);
        } while ((uVar30 & 0x7fffffff) != uVar23);
      }
    }
  }
  if (local_208.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0042ae72:
  if (local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar22;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = expf(wptr[0]) * bias_w / w;
                    float bbox_h = expf(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}